

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O3

bool __thiscall xray_re::xr_ogf_v3::progressive(xr_ogf_v3 *this)

{
  return ((this->super_xr_ogf).m_model_type & ~MT3_HIERRARHY) == MT3_PROGRESSIVE;
}

Assistant:

bool xr_ogf_v3::progressive() const
{
	switch (m_model_type) {
	case MT3_PROGRESSIVE:
	case MT3_SKELETON_GEOMDEF_PM:
		return true;
	default:
		return false;
	}
}